

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void readObject(ifstream *stream)

{
  undefined4 in_EAX;
  uint32_t uVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  bool bVar4;
  uint32_t id;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  uVar1 = readUINT32(stream);
  uStack_28 = CONCAT44(uVar1,(undefined4)uStack_28) & 0xffffffffffffff;
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  uVar2 = readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  switch(uVar1 >> 0x18) {
  case 0:
    pmVar3 = std::
             map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
             ::at(&itemSubtype,(key_type *)((long)&uStack_28 + 4));
    switch(*pmVar3) {
    case '\x03':
      goto switchD_0010256f_caseD_1;
    case '\x04':
    case '\x05':
    case '\x06':
switchD_0010256f_caseD_0:
      readUINT32(stream);
switchD_00102515_caseD_3:
      if (0 < (int)uVar2) {
        while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
          readUINT32(stream);
          readObject(stream);
        }
      }
      return;
    default:
      goto switchD_00102515_caseD_3;
    }
  case 1:
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    break;
  case 2:
    pmVar3 = std::
             map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
             ::at(&scenerySubtype,(key_type *)((long)&uStack_28 + 4));
    switch(*pmVar3) {
    case '\0':
      goto switchD_0010256f_caseD_0;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
      goto switchD_0010256f_caseD_1;
    default:
      goto switchD_00102515_caseD_3;
    }
  default:
    goto switchD_00102515_caseD_3;
  case 5:
    if ((7 < (uVar1 & 0xffffff) - 0x10) && ((uVar1 & 0xffffff) == 0xc))
    goto switchD_00102515_caseD_3;
  }
  readUINT32(stream);
  readUINT32(stream);
switchD_0010256f_caseD_1:
  readUINT32(stream);
  goto switchD_0010256f_caseD_0;
}

Assistant:

void readObject(std::ifstream& stream)
{
    readUINT32(stream); // unknown 0
    readINT32(stream);  // position
    readUINT32(stream); // unknown 1
    readUINT32(stream); // unknown 2
    readUINT32(stream); // unknown 3
    readUINT32(stream); // unknown 4
    readUINT32(stream); // frame number
    readUINT32(stream); // orientation
    readUINT32(stream); // FID
    readUINT32(stream); // FLAGS
    readUINT32(stream); // elevation
    uint32_t PID = readUINT32(stream);

    uint32_t type = (PID & 0xFF000000) >> 24;
    uint32_t id  = PID & 0x00FFFFFF;

    readUINT32(stream); // unknown 5
    readUINT32(stream); // unknown 6
    readUINT32(stream); // unknown 7
    readUINT32(stream); // unknown 8
    readUINT32(stream); // SID
    readUINT32(stream); // SID
    int32_t inventorySize = readINT32(stream);
    readUINT32(stream); // unknown 9
    readUINT32(stream); // unknown 10
    readUINT32(stream); // unknown 11

    switch (type)
    {
        case 0: // items
        {
            uint32_t subtype = itemSubtype.at(id);
            switch (subtype)
            {
                case 0: // armor
                    break;
                case 1: // container
                    break;
                case 2: // drug
                    break;
                case 3: // weapon
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ammo
                    readUINT32(stream);
                    break;
                case 5: // misc
                    readUINT32(stream);
                    break;
                case 6: // key
                    readUINT32(stream);
                    break;
            }
            break;
        }
        case 1: // critters:
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            break;
        case 2: // scenery
        {
            uint32_t subtype = scenerySubtype.at(id);
            switch (subtype)
            {
                case 0: // door
                    readUINT32(stream);
                    break;
                case 1: // stairs
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 2: // elevator
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 3: // ladder bottom
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ladder top
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 5: // generic
                    break;
            }
            break;
        }
        case 3:
            break;
        case 4:
            break;
        case 5:
        {
            switch(id)
            {
                case 12:
                    break;
                // Exit Grids
                case 16:
                case 17:
                case 18:
                case 19:
                case 20:
                case 21:
                case 22:
                case 23:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                default:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
            }
            break;
        }
    }

    if (inventorySize > 0)
    {
        for (unsigned i = 0; i != inventorySize; ++i)
        {
            readUINT32(stream); // ammount
            readObject(stream);
        }
    }
}